

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O0

WebPMuxError WebPMuxSetChunk(WebPMux *mux,char *fourcc,WebPData *chunk_data,int copy_data)

{
  long *in_RDX;
  char *in_RSI;
  long in_RDI;
  uint32_t unaff_retaddr;
  WebPMux *in_stack_00000008;
  WebPMuxError err;
  uint32_t tag;
  WebPMux *in_stack_ffffffffffffffc8;
  int copy_data_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  WebPMuxError WVar1;
  
  if ((((in_RDI == 0) || (in_RSI == (char *)0x0)) || (in_RDX == (long *)0x0)) ||
     ((*in_RDX == 0 || (0xfffffff6 < (ulong)in_RDX[1])))) {
    WVar1 = WEBP_MUX_INVALID_ARGUMENT;
  }
  else {
    ChunkGetTagFromFourCC(in_RSI);
    copy_data_00 = (int)((ulong)in_RDI >> 0x20);
    WVar1 = MuxDeleteAllNamedData(in_stack_ffffffffffffffc8,0);
    if ((WVar1 == WEBP_MUX_OK) || (WVar1 == WEBP_MUX_NOT_FOUND)) {
      WVar1 = MuxSet(in_stack_00000008,unaff_retaddr,
                     (WebPData *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     copy_data_00);
    }
  }
  return WVar1;
}

Assistant:

WebPMuxError WebPMuxSetChunk(WebPMux* mux, const char fourcc[4],
                             const WebPData* chunk_data, int copy_data) {
  uint32_t tag;
  WebPMuxError err;
  if (mux == NULL || fourcc == NULL || chunk_data == NULL ||
      chunk_data->bytes == NULL || chunk_data->size > MAX_CHUNK_PAYLOAD) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  tag = ChunkGetTagFromFourCC(fourcc);

  // Delete existing chunk(s) with the same 'fourcc'.
  err = MuxDeleteAllNamedData(mux, tag);
  if (err != WEBP_MUX_OK && err != WEBP_MUX_NOT_FOUND) return err;

  // Add the given chunk.
  return MuxSet(mux, tag, chunk_data, copy_data);
}